

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::_InternalParse
          (CodeGeneratorResponse_File *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char cVar4;
  uint32 res;
  uint tag;
  string *s;
  char *ptr_00;
  ArenaStringPtr *this_00;
  pair<const_char_*,_unsigned_int> pVar5;
  pair<const_char_*,_bool> pVar6;
  
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        return (char *)(byte *)ptr;
      }
      pVar6 = internal::EpsCopyInputStream::DoneFallback
                        (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar6.first;
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (char *)(byte *)ptr;
      }
    }
    bVar1 = *ptr;
    pVar5.second._0_1_ = bVar1;
    pVar5.first = (char *)((byte *)ptr + 1);
    pVar5._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar5 = internal::ReadTagFallback(ptr,res);
        if (pVar5.first == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        pVar5.second = res;
        pVar5.first = (char *)((byte *)ptr + 2);
        pVar5._12_4_ = 0;
      }
    }
    ptr_00 = pVar5.first;
    tag = pVar5.second;
    uVar3 = (uint)(pVar5._8_8_ >> 3) & 0x1fffffff;
    cVar4 = (char)pVar5.second;
    if (uVar3 == 0xf) {
      if (cVar4 == 'z') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        s = (this->content_).ptr_;
        this_00 = &this->content_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_00219152;
        goto LAB_00219161;
      }
LAB_0021916e:
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        return ptr_00;
      }
      ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr_00,ctx);
    }
    else {
      if (uVar3 == 2) {
        if (cVar4 == '\x12') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          s = (this->insertion_point_).ptr_;
          this_00 = &this->insertion_point_;
          if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_00219152;
          goto LAB_00219161;
        }
        goto LAB_0021916e;
      }
      if ((uVar3 != 1) || (cVar4 != '\n')) goto LAB_0021916e;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      s = (this->name_).ptr_;
      this_00 = &this->name_;
      if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
LAB_00219152:
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        s = this_00->ptr_;
      }
LAB_00219161:
      ptr = internal::InlineGreedyStringParser(s,ptr_00,ctx);
    }
    if ((byte *)ptr == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* CodeGeneratorResponse_File::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorResponse.File.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string insertion_point = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_insertion_point(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string content = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_content(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorResponse.File.content");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}